

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestExtensionRangeSerialize::_InternalSerialize
          (TestExtensionRangeSerialize *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int32_t iVar3;
  uint32_t *puVar4;
  TestExtensionRangeSerialize *pTVar5;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestExtensionRangeSerialize *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestExtensionRangeSerialize *this_local;
  
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    iVar3 = _internal_foo_one(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,iVar3,target);
  }
  pTVar5 = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)pTVar5,2,5,
                            (uint8_t *)stream_local,stream);
  if ((uVar1 & 2) != 0) {
    iVar3 = _internal_foo_two(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<6>
                             (stream,iVar3,(uint8_t *)stream_local);
  }
  if ((uVar1 & 4) != 0) {
    iVar3 = _internal_foo_three(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<7>
                             (stream,iVar3,(uint8_t *)stream_local);
  }
  pTVar5 = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)pTVar5,9,0xb,
                            (uint8_t *)stream_local,stream);
  if ((uVar1 & 8) != 0) {
    iVar3 = _internal_foo_four(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<13>
                             (stream,iVar3,(uint8_t *)stream_local);
  }
  pTVar5 = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)pTVar5,0xf,0x14,
                            (uint8_t *)stream_local,stream);
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestExtensionRangeSerialize::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestExtensionRangeSerialize& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestExtensionRangeSerialize)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 foo_one = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_foo_one(), target);
  }

  // Extension range [2, 5)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 2, 5, target, stream);
  // int32 foo_two = 6;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<6>(
            stream, this_._internal_foo_two(), target);
  }

  // int32 foo_three = 7;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<7>(
            stream, this_._internal_foo_three(), target);
  }

  // Extension range [9, 11)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 9, 11, target, stream);
  // int32 foo_four = 13;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<13>(
            stream, this_._internal_foo_four(), target);
  }

  // Extension range [15, 20)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 15, 20, target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestExtensionRangeSerialize)
  return target;
}